

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::EnumDescriptorProto::MergeFrom
          (EnumDescriptorProto *this,EnumDescriptorProto *from)

{
  InternalMetadata *this_00;
  uint uVar1;
  void *pvVar2;
  string *initial_value;
  string *psVar3;
  LogMessage *other;
  EnumOptions *this_01;
  Arena *pAVar4;
  undefined1 *from_00;
  LogMessage local_68;
  LogFinisher local_29;
  
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/descriptor.pb.cc"
               ,0x13da);
    other = internal::LogMessage::operator<<(&local_68,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_29,other);
    internal::LogMessage::~LogMessage(&local_68);
  }
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  pvVar2 = (from->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              (this_00,(UnknownFieldSet *)(((ulong)pvVar2 & 0xfffffffffffffffe) + 8));
  }
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::TypeHandler>
            (&(this->value_).super_RepeatedPtrFieldBase,&(from->value_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto_EnumReservedRange>::TypeHandler>
            (&(this->reserved_range_).super_RepeatedPtrFieldBase,
             &(from->reserved_range_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->reserved_name_).super_RepeatedPtrFieldBase,
             &(from->reserved_name_).super_RepeatedPtrFieldBase);
  uVar1 = (from->_has_bits_).has_bits_[0];
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      initial_value = (from->name_).ptr_;
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | 1;
      pAVar4 = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar4 & 1) != 0) {
        pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
      }
      psVar3 = (this->name_).ptr_;
      if (psVar3 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstance(&this->name_,pAVar4,initial_value);
      }
      else {
        std::__cxx11::string::_M_assign((string *)psVar3);
      }
    }
    if ((uVar1 & 2) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
      this_01 = this->options_;
      if (this_01 == (EnumOptions *)0x0) {
        pAVar4 = (Arena *)this_00->ptr_;
        if (((ulong)pAVar4 & 1) != 0) {
          pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
        }
        this_01 = Arena::CreateMaybeMessage<google::protobuf::EnumOptions>(pAVar4);
        this->options_ = this_01;
      }
      from_00 = (undefined1 *)from->options_;
      if ((EnumOptions *)from_00 == (EnumOptions *)0x0) {
        from_00 = _EnumOptions_default_instance_;
      }
      EnumOptions::MergeFrom(this_01,(EnumOptions *)from_00);
    }
  }
  return;
}

Assistant:

void EnumDescriptorProto::MergeFrom(const EnumDescriptorProto& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.EnumDescriptorProto)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(from._internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  value_.MergeFrom(from.value_);
  reserved_range_.MergeFrom(from.reserved_range_);
  reserved_name_.MergeFrom(from.reserved_name_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 0x00000003u) {
    if (cached_has_bits & 0x00000001u) {
      _internal_set_name(from._internal_name());
    }
    if (cached_has_bits & 0x00000002u) {
      _internal_mutable_options()->PROTOBUF_NAMESPACE_ID::EnumOptions::MergeFrom(from._internal_options());
    }
  }
}